

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O2

void compare_services(vector<t_service_*,_std::allocator<t_service_*>_> *newServices,
                     vector<t_service_*,_std::allocator<t_service_*>_> *oldServices)

{
  _Rb_tree_header *p_Var1;
  pointer pptVar2;
  mapped_type ptVar3;
  long *plVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  mapped_type *pptVar7;
  undefined4 extraout_var_00;
  iterator iVar8;
  undefined4 extraout_var_01;
  string *psVar9;
  pointer pptVar10;
  string oldServiceName;
  string oldExtendsName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
  newServiceMap;
  string newExtendsName;
  key_type local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = &local_80._M_impl.super__Rb_tree_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  pptVar2 = (newServices->super__Vector_base<t_service_*,_std::allocator<t_service_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  pptVar10 = (newServices->super__Vector_base<t_service_*,_std::allocator<t_service_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; pptVar10 != pptVar2; pptVar10 = pptVar10 + 1) {
    ptVar3 = *pptVar10;
    iVar6 = (*(ptVar3->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar3);
    pptVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
                            *)&local_80,(key_type *)CONCAT44(extraout_var,iVar6));
    *pptVar7 = ptVar3;
  }
  for (pptVar10 = (oldServices->super__Vector_base<t_service_*,_std::allocator<t_service_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      pptVar10 !=
      (oldServices->super__Vector_base<t_service_*,_std::allocator<t_service_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; pptVar10 = pptVar10 + 1) {
    iVar6 = (*((*pptVar10)->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string((string *)&local_c0,(string *)CONCAT44(extraout_var_00,iVar6));
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
            ::find(&local_80,&local_c0);
    if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
      thrift_audit_failure("New Thrift file is missing a service %s\n",local_c0._M_dataplus._M_p);
    }
    else {
      if ((*pptVar10)->extends_ != (t_service *)0x0) {
        plVar4 = *(long **)(*(long *)(iVar8._M_node + 2) + 0xa0);
        if (plVar4 == (long *)0x0) {
          thrift_audit_failure("Change in Service inheritance for %s\n",local_c0._M_dataplus._M_p);
        }
        else {
          iVar6 = (*((*pptVar10)->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
          std::__cxx11::string::string
                    ((string *)&local_a0,(string *)CONCAT44(extraout_var_01,iVar6));
          psVar9 = (string *)(**(code **)(*plVar4 + 0x18))(plVar4);
          std::__cxx11::string::string((string *)&local_50,psVar9);
          bVar5 = std::operator!=(&local_50,&local_a0);
          if (bVar5) {
            thrift_audit_failure("Change in Service inheritance for %s\n",local_c0._M_dataplus._M_p)
            ;
          }
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_a0);
        }
      }
      compare_functions((vector<t_function_*,_std::allocator<t_function_*>_> *)
                        (*(long *)(iVar8._M_node + 2) + 0x88),&(*pptVar10)->functions_);
    }
    std::__cxx11::string::~string((string *)&local_c0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

void compare_services(const std::vector<t_service*>& newServices, const std::vector<t_service*>& oldServices)
{
   std::vector<t_service*>::const_iterator oldServiceIt;

   std::map<std::string, t_service*> newServiceMap;
   for(auto newService : newServices)
   {
      newServiceMap[newService->get_name()] = newService;
   }


   for(oldServiceIt = oldServices.begin(); oldServiceIt != oldServices.end(); oldServiceIt++)
   {
      const std::string oldServiceName = (*oldServiceIt)->get_name();
      auto newServiceMapIt = newServiceMap.find(oldServiceName);

      if(newServiceMapIt == newServiceMap.end())
      {
         thrift_audit_failure("New Thrift file is missing a service %s\n", oldServiceName.c_str());
      }
      else
      {
         t_service* oldServiceExtends = (*oldServiceIt)->get_extends();
         t_service* newServiceExtends = (newServiceMapIt->second)->get_extends();

         if(oldServiceExtends == nullptr)
         {
            // It is fine to add extends. So if service in older thrift did not have any extends, we are fine.
            // DO Nothing
         }
         else if(oldServiceExtends != nullptr && newServiceExtends == nullptr)
         {
            thrift_audit_failure("Change in Service inheritance for %s\n", oldServiceName.c_str());
         }
         else
         {
            std::string oldExtendsName = oldServiceExtends->get_name();
            std::string newExtendsName = newServiceExtends->get_name();

            if( newExtendsName != oldExtendsName)
            {
               thrift_audit_failure("Change in Service inheritance for %s\n", oldServiceName.c_str());
            }
         }

         compare_functions((newServiceMapIt->second)->get_functions(), (*oldServiceIt)->get_functions());
      }

   }

}